

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edition_unittest.pb.cc
# Opt level: O0

void __thiscall
edition_unittest::TestIsInitialized_SubMessage::~TestIsInitialized_SubMessage
          (TestIsInitialized_SubMessage *this)

{
  TestIsInitialized_SubMessage *this_local;
  
  ~TestIsInitialized_SubMessage(this);
  operator_delete(this,0x20);
  return;
}

Assistant:

TestIsInitialized_SubMessage::~TestIsInitialized_SubMessage() {
  // @@protoc_insertion_point(destructor:edition_unittest.TestIsInitialized.SubMessage)
  SharedDtor(*this);
}